

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptError * __thiscall
Js::JavascriptLibrary::CreateStackOverflowError(JavascriptLibrary *this)

{
  Recycler *recycler;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  JavascriptError *pError;
  ScriptContext **ppSVar1;
  JavascriptError *stackOverflowError;
  AutoAllowAllocationDuringHeapEnum autoAllowAllocationDuringHeapEnum;
  JavascriptLibrary *this_local;
  
  autoAllowAllocationDuringHeapEnum.super_AutoBooleanToggle._8_8_ = this;
  recycler = GetRecycler(this);
  Memory::Recycler::AutoAllowAllocationDuringHeapEnum::AutoAllowAllocationDuringHeapEnum
            ((AutoAllowAllocationDuringHeapEnum *)&stackOverflowError,recycler);
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  this_01 = ScriptContext::GetLibrary(this_00);
  pError = CreateError(this_01);
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  JavascriptError::SetErrorMessage(pError,-0x7ff5ffe4,(PCWSTR)0x0,*ppSVar1);
  Memory::Recycler::AutoAllowAllocationDuringHeapEnum::~AutoAllowAllocationDuringHeapEnum
            ((AutoAllowAllocationDuringHeapEnum *)&stackOverflowError);
  return pError;
}

Assistant:

JavascriptError* JavascriptLibrary::CreateStackOverflowError()
    {
#if DBG
        // If we are doing a heap enum, we need to be able to allocate the error object.
        Recycler::AutoAllowAllocationDuringHeapEnum autoAllowAllocationDuringHeapEnum(this->GetRecycler());
#endif

        JavascriptError* stackOverflowError = scriptContext->GetLibrary()->CreateError();
        JavascriptError::SetErrorMessage(stackOverflowError, VBSERR_OutOfStack, NULL, scriptContext);
        return stackOverflowError;
    }